

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

char * nlohmann::detail::dtoa_impl::append_exponent(char *buf,int e)

{
  byte bVar2;
  uint uVar1;
  ushort uVar3;
  byte *pbVar4;
  long lStack_10;
  
  if (e < -999) {
    __assert_fail("e > -1000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                  ,0x23dc,"char *nlohmann::detail::dtoa_impl::append_exponent(char *, int)");
  }
  if (999 < e) {
    __assert_fail("e < 1000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                  ,0x23dd,"char *nlohmann::detail::dtoa_impl::append_exponent(char *, int)");
  }
  uVar1 = -e;
  if (0 < e) {
    uVar1 = e;
  }
  *buf = (char)(e >> 0x1f) * -2 + '+';
  if (uVar1 < 10) {
    buf[1] = '0';
  }
  else {
    if (99 < uVar1) {
      uVar3 = (ushort)((uVar1 & 0xffff) % 100);
      buf[1] = (char)((uVar1 & 0xffff) / 100) + '0';
      bVar2 = (byte)(uVar3 % 10);
      pbVar4 = (byte *)(buf + 3);
      buf[2] = (byte)(uVar3 / 10) | 0x30;
      lStack_10 = 4;
      goto LAB_00194f3e;
    }
    uVar3 = (ushort)uVar1 & 0xff;
    uVar1 = (uint)(byte)(uVar3 % 10);
    buf[1] = (byte)(uVar3 / 10) | 0x30;
  }
  pbVar4 = (byte *)(buf + 2);
  bVar2 = (byte)uVar1;
  lStack_10 = 3;
LAB_00194f3e:
  *pbVar4 = bVar2 | 0x30;
  return buf + lStack_10;
}

Assistant:

inline char* append_exponent(char* buf, int e) {
	assert(e > -1000);
	assert(e < 1000);

	if (e < 0) {
		e = -e;
		*buf++ = '-';
	} else {
		*buf++ = '+';
	}

	auto k = static_cast<uint32_t>(e);
	if (k < 10) {
		// Always print at least two digits in the exponent.
		// This is for compatibility with printf("%g").
		*buf++ = '0';
		*buf++ = static_cast<char>('0' + k);
	} else if (k < 100) {
		*buf++ = static_cast<char>('0' + k / 10);
		k %= 10;
		*buf++ = static_cast<char>('0' + k);
	} else {
		*buf++ = static_cast<char>('0' + k / 100);
		k %= 100;
		*buf++ = static_cast<char>('0' + k / 10);
		k %= 10;
		*buf++ = static_cast<char>('0' + k);
	}

	return buf;
}